

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_recalculate_mpr(void)

{
  list_entity **pplVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  long lVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  list_entity *plVar7;
  
  plVar2 = _domain_list.prev;
  plVar7 = _domain_list.next;
  if ((_domain_list.next)->prev != _domain_list.prev) {
    do {
      if (*(char *)&plVar7[-0x27].prev == '\x01') {
        if ((plVar7[-0x28].prev)->prev != (list_entity *)0x0) {
          plVar2 = nhdp_db_get_neigh_list();
          for (plVar2 = plVar2->next; plVar5 = plVar2->prev, plVar3 = nhdp_db_get_neigh_list(),
              plVar5 != plVar3->prev; plVar2 = plVar2->next) {
            lVar4 = (long)*(int *)((long)&plVar7[-0x27].next + 4);
            *(undefined1 *)((long)&plVar2[lVar4 * 2 + 6].next + 2) =
                 *(undefined1 *)((long)&plVar2[lVar4 * 2 + 6].next + 1);
          }
          plVar2 = plVar7 + -0x2a;
          (*(code *)(plVar7[-0x28].prev)->prev)(plVar2);
          plVar5 = nhdp_db_get_neigh_list();
          do {
            plVar5 = plVar5->next;
            plVar3 = plVar5->prev;
            plVar6 = nhdp_db_get_neigh_list();
            if (plVar3 == plVar6->prev) goto LAB_0012bee6;
            lVar4 = (long)*(int *)((long)&plVar7[-0x27].next + 4);
          } while (*(char *)((long)&plVar5[lVar4 * 2 + 6].next + 2) ==
                   *(char *)((long)&plVar5[lVar4 * 2 + 6].next + 1));
          if ((log_global_mask[LOG_NHDP] & 1) != 0) {
            oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",1000,(void *)0x0,0,
                     "Domain ext %u MPR set changed",(ulong)*(byte *)((long)&plVar7[-0x27].next + 1)
                    );
          }
          (*(code *)(plVar7[-0x28].prev)->prev)(plVar2);
          plVar3 = _domain_listener_list.prev;
          for (plVar5 = _domain_listener_list.next; plVar5->prev != plVar3; plVar5 = plVar5->next) {
            if (plVar5[-1].next != (list_entity *)0x0) {
              (*(code *)plVar5[-1].next)(plVar2);
              plVar3 = _domain_listener_list.prev;
            }
          }
        }
LAB_0012bee6:
        *(undefined1 *)&plVar7[-0x27].prev = 0;
        plVar2 = _domain_list.prev;
      }
      pplVar1 = &plVar7->next;
      plVar7 = *pplVar1;
    } while ((*pplVar1)->prev != plVar2);
  }
  if (_flooding_domain._mpr_outdated == true) {
    plVar2 = nhdp_db_get_link_list();
    for (plVar2 = plVar2->next; plVar7 = plVar2->prev, plVar5 = nhdp_db_get_link_list(),
        plVar7 != plVar5->prev; plVar2 = plVar2->next) {
      *(undefined1 *)((long)&plVar2[-6].prev + 3) = *(undefined1 *)((long)&plVar2[-6].prev + 1);
    }
    (*(_flooding_domain.mpr)->update_flooding_mpr)(&_flooding_domain);
    plVar2 = nhdp_db_get_link_list();
    do {
      plVar2 = plVar2->next;
      plVar7 = plVar2->prev;
      plVar5 = nhdp_db_get_link_list();
      if (plVar7 == plVar5->prev) goto LAB_0012bffa;
    } while (*(char *)((long)&plVar2[-6].prev + 3) == *(char *)((long)&plVar2[-6].prev + 1));
    if ((log_global_mask[LOG_NHDP] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x3c6,(void *)0x0,0,
               "Flooding domain MPR set changed");
    }
    (*(_flooding_domain.mpr)->update_flooding_mpr)(&_flooding_domain);
    plVar2 = _domain_listener_list.prev;
    plVar7 = _domain_listener_list.next;
    if ((_domain_listener_list.next)->prev != _domain_listener_list.prev) {
      do {
        if (plVar7[-1].next != (list_entity *)0x0) {
          (*(code *)plVar7[-1].next)(&_flooding_domain);
          plVar2 = _domain_listener_list.prev;
        }
        pplVar1 = &plVar7->next;
        plVar7 = *pplVar1;
      } while ((*pplVar1)->prev != plVar2);
    }
LAB_0012bffa:
    _flooding_domain._mpr_outdated = false;
  }
  return;
}

Assistant:

void
nhdp_domain_recalculate_mpr(void) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->_mpr_outdated) {
      if (_recalculate_routing_mpr_set(domain)) {
        domain->mpr->update_routing_mpr(domain);
        _fire_mpr_changed(domain);
      }
      domain->_mpr_outdated = false;
    }
  }
  if (_flooding_domain._mpr_outdated) {
    if (_recalculate_flooding_mpr_set()) {
      _flooding_domain.mpr->update_flooding_mpr(&_flooding_domain);
      _fire_mpr_changed(&_flooding_domain);
    }
    _flooding_domain._mpr_outdated = false;
  }
}